

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

char * read_word(int wantbrace)

{
  int iVar1;
  bool bVar2;
  bool local_26;
  bool local_25;
  int local_24;
  int local_20;
  int length_1;
  int nesting;
  int length;
  int x;
  int wantbrace_local;
  
  do {
    while( true ) {
      while( true ) {
        nesting = getc((FILE *)fin);
        if ((nesting < 0) && (iVar1 = feof((FILE *)fin), iVar1 != 0)) {
          return (char *)0x0;
        }
        if (nesting != 0x23) break;
        do {
          iVar1 = getc((FILE *)fin);
          local_25 = -1 < iVar1 && iVar1 != 10;
        } while (local_25);
        lineno = lineno + 1;
      }
      if (nesting != 10) break;
      lineno = lineno + 1;
    }
    iVar1 = isspace(nesting & 0xff);
  } while (iVar1 != 0);
  expand_buffer(100);
  if ((nesting != 0x7b) || (wantbrace != 0)) {
    if ((nesting == 0x7b) || (nesting == 0x7d)) {
      *buffer = (char)nesting;
      buffer[1] = '\0';
    }
    else {
      local_24 = 0;
LAB_001bbcbd:
      if (nesting == 0x5c) goto code_r0x001bbcc3;
      if ((((-1 < nesting) && (iVar1 = isspace(nesting & 0xff), iVar1 == 0)) && (nesting != 0x7b))
         && ((nesting != 0x7d && (nesting != 0x23)))) goto LAB_001bbd04;
      ungetc(nesting,(FILE *)fin);
      buffer[local_24] = '\0';
    }
    return buffer;
  }
  length_1 = 0;
  local_20 = 0;
LAB_001bbb65:
  nesting = getc((FILE *)fin);
  if (nesting < 0) {
    read_error("Missing \'}\'");
LAB_001bbc62:
    buffer[length_1] = '\0';
    return buffer;
  }
  if (nesting == 0x23) {
    do {
      iVar1 = getc((FILE *)fin);
      local_26 = -1 < iVar1 && iVar1 != 10;
    } while (local_26);
    lineno = lineno + 1;
    goto LAB_001bbb65;
  }
  if (nesting == 10) {
    lineno = lineno + 1;
    goto LAB_001bbc34;
  }
  if (nesting == 0x5c) goto code_r0x001bbbee;
  if (nesting != 0x7b) {
    if ((nesting != 0x7d) || (bVar2 = local_20 != 0, local_20 = local_20 + -1, bVar2))
    goto LAB_001bbc34;
    goto LAB_001bbc62;
  }
  local_20 = local_20 + 1;
LAB_001bbc34:
  buffer[length_1] = (char)nesting;
  expand_buffer(length_1 + 1);
  length_1 = length_1 + 1;
  goto LAB_001bbb65;
code_r0x001bbbee:
  nesting = read_quoted();
  if (nesting < 0) goto LAB_001bbb65;
  goto LAB_001bbc34;
code_r0x001bbcc3:
  nesting = read_quoted();
  if (-1 < nesting) {
LAB_001bbd04:
    buffer[local_24] = (char)nesting;
    expand_buffer(local_24 + 1);
    nesting = getc((FILE *)fin);
    local_24 = local_24 + 1;
  }
  goto LAB_001bbcbd;
}

Assistant:

const char *read_word(int wantbrace) {
  int x;

  // skip all the whitespace before it:
  for (;;) {
    x = getc(fin);
    if (x < 0 && feof(fin)) {	// eof
      return 0;
    } else if (x == '#') {	// comment
      do x = getc(fin); while (x >= 0 && x != '\n');
      lineno++;
      continue;
    } else if (x == '\n') {
      lineno++;
    } else if (!isspace(x & 255)) {
      break;
    }
  }

  expand_buffer(100);

  if (x == '{' && !wantbrace) {

    // read in whatever is between braces
    int length = 0;
    int nesting = 0;
    for (;;) {
      x = getc(fin);
      if (x<0) {read_error("Missing '}'"); break;}
      else if (x == '#') { // embedded comment
	do x = getc(fin); while (x >= 0 && x != '\n');
	lineno++;
	continue;
      } else if (x == '\n') lineno++;
      else if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x == '{') nesting++;
      else if (x == '}') {if (!nesting--) break;}
      buffer[length++] = x;
      expand_buffer(length);
    }
    buffer[length] = 0;
    return buffer;

  } else if (x == '{' || x == '}') {
    // all the punctuation is a word:
    buffer[0] = x;
    buffer[1] = 0;
    return buffer;

  } else {

    // read in an unquoted word:
    int length = 0;
    for (;;) {
      if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x<0 || isspace(x & 255) || x=='{' || x=='}' || x=='#') break;
      buffer[length++] = x;
      expand_buffer(length);
      x = getc(fin);
    }
    ungetc(x, fin);
    buffer[length] = 0;
    return buffer;

  }
}